

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool picojson::
     _parse_string<std::__cxx11::string,std::istreambuf_iterator<char,std::char_traits<char>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  FILE *__stream_00;
  char cVar3;
  int ch;
  input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_local;
  
  __stream_00 = (FILE *)in;
  while( true ) {
    iVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc(in,__stream_00);
    if (iVar2 < 0x20) {
      input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::ungetc
                (in,(int)__stream_00,__stream);
      return false;
    }
    if (iVar2 == 0x22) break;
    cVar3 = (char)out;
    if (iVar2 == 0x5c) {
      iVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc(in,__stream_00);
      if (iVar2 == -1) {
        return false;
      }
      switch(iVar2) {
      case 0x22:
        __stream_00 = (FILE *)0x22;
        std::__cxx11::string::push_back(cVar3);
        break;
      default:
        return false;
      case 0x2f:
        __stream_00 = (FILE *)0x2f;
        std::__cxx11::string::push_back(cVar3);
        break;
      case 0x5c:
        __stream_00 = (FILE *)0x5c;
        std::__cxx11::string::push_back(cVar3);
        break;
      case 0x62:
        __stream_00 = (FILE *)0x8;
        std::__cxx11::string::push_back(cVar3);
        break;
      case 0x66:
        __stream_00 = (FILE *)0xc;
        std::__cxx11::string::push_back(cVar3);
        break;
      case 0x6e:
        __stream_00 = (FILE *)0xa;
        std::__cxx11::string::push_back(cVar3);
        break;
      case 0x72:
        __stream_00 = (FILE *)0xd;
        std::__cxx11::string::push_back(cVar3);
        break;
      case 0x74:
        __stream_00 = (FILE *)0x9;
        std::__cxx11::string::push_back(cVar3);
        break;
      case 0x75:
        __stream_00 = (FILE *)in;
        bVar1 = _parse_codepoint<std::__cxx11::string,std::istreambuf_iterator<char,std::char_traits<char>>>
                          (out,in);
        if (!bVar1) {
          return false;
        }
      }
    }
    else {
      __stream_00 = (FILE *)(ulong)(uint)(int)(char)iVar2;
      std::__cxx11::string::push_back(cVar3);
    }
  }
  return true;
}

Assistant:

inline bool _parse_string(String& out, input<Iter>& in) {
    while (1) {
      int ch = in.getc();
      if (ch < ' ') {
    in.ungetc();
    return false;
      } else if (ch == '"') {
    return true;
      } else if (ch == '\\') {
    if ((ch = in.getc()) == -1) {
      return false;
    }
    switch (ch) {
#define MAP(sym, val) case sym: out.push_back(val); break
      MAP('"', '\"');
      MAP('\\', '\\');
      MAP('/', '/');
      MAP('b', '\b');
      MAP('f', '\f');
      MAP('n', '\n');
      MAP('r', '\r');
      MAP('t', '\t');
#undef MAP
    case 'u':
      if (! _parse_codepoint(out, in)) {
        return false;
      }
      break;
    default:
      return false;
    }
      } else {
    out.push_back(ch);
      }
    }
    return false;
  }